

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.h
# Opt level: O2

RpcSystem<capnp::rpc::twoparty::VatId> __thiscall
capnp::
makeRpcClient<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>
          (capnp *this,
          VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>
          *network)

{
  Impl *extraout_RDX;
  RpcSystem<capnp::rpc::twoparty::VatId> RVar1;
  NullableValue<capnp::Capability::Client> local_40;
  NullableValue<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>
  local_28;
  
  local_40.isSet = false;
  local_28.isSet = false;
  RpcSystem<capnp::rpc::twoparty::VatId>::
  RpcSystem<capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>
            ((RpcSystem<capnp::rpc::twoparty::VatId> *)this,network,
             (Maybe<capnp::Capability::Client> *)&local_40,
             (Maybe<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>
              *)&local_28);
  kj::_::
  NullableValue<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>
  ::~NullableValue(&local_28);
  kj::_::NullableValue<capnp::Capability::Client>::~NullableValue(&local_40);
  RVar1.super_RpcSystemBase.impl.ptr = extraout_RDX;
  RVar1.super_RpcSystemBase.impl.disposer = (Disposer *)this;
  return (RpcSystem<capnp::rpc::twoparty::VatId>)RVar1.super_RpcSystemBase.impl;
}

Assistant:

RpcSystem<VatId> makeRpcClient(
    VatNetwork<VatId, ProvisionId, RecipientId, ThirdPartyCapId, JoinResult>& network) {
  return RpcSystem<VatId>(network, nullptr);
}